

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_block.cpp
# Opt level: O0

Block * __thiscall cfd::core::Block::operator=(Block *this,Block *object)

{
  Block *object_local;
  Block *this_local;
  
  if (this != object) {
    ByteData::operator=(&this->data_,&object->data_);
    BlockHeader::operator=(&this->header_,&object->header_);
    ::std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::operator=
              (&this->txs_,&object->txs_);
    ::std::vector<cfd::core::Txid,_std::allocator<cfd::core::Txid>_>::operator=
              (&this->txids_,&object->txids_);
  }
  return this;
}

Assistant:

Block& Block::operator=(const Block& object) {
  if (this != &object) {
    data_ = object.data_;
    header_ = object.header_;
    txs_ = object.txs_;
    txids_ = object.txids_;
  }
  return *this;
}